

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O1

void cmFortranParser_RuleModule(cmFortranParser *parser,char *module_name)

{
  cmFortranSourceInfo *pcVar1;
  cmFortranParser_s *this;
  allocator<char> local_51;
  _Alloc_hider local_50;
  undefined8 local_40;
  _Alloc_hider local_30;
  undefined8 local_20;
  
  if ((parser->InPPFalseBranch == 0) && (parser->InInterface == false)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffb0,module_name,&local_51);
    this = (cmFortranParser_s *)&stack0xffffffffffffffb0;
    cmsys::SystemTools::LowerCase((string *)&stack0xffffffffffffffd0,(string *)this);
    if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
      this = (cmFortranParser_s *)(local_40 + 1);
      operator_delete(local_50._M_p,(ulong)this);
    }
    pcVar1 = parser->Info;
    cmFortranParser_s::ModName
              ((string *)&stack0xffffffffffffffb0,this,(string *)&stack0xffffffffffffffd0);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pcVar1->Provides,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffb0);
    if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
      operator_delete(local_50._M_p,local_40 + 1);
    }
    if (local_30._M_p != (pointer)&stack0xffffffffffffffe0) {
      operator_delete(local_30._M_p,local_20 + 1);
    }
  }
  return;
}

Assistant:

void cmFortranParser_RuleModule(cmFortranParser* parser,
                                const char* module_name)
{
  if (parser->InPPFalseBranch) {
    return;
  }

  if (!parser->InInterface) {
    // syntax:   "module module_name"
    // provides: "module_name.mod"
    std::string const& mod_name = cmSystemTools::LowerCase(module_name);
    parser->Info.Provides.insert(parser->ModName(mod_name));
  }
}